

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkAfterTrim(Aig_Man_t *pMan,Abc_Ntk_t *pNtkOld)

{
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  ulong uVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  uint uVar11;
  Abc_Ntk_t *pAVar12;
  int iVar13;
  long lVar14;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x447,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->nBarBufs != 0) {
    __assert_fail("pNtkOld->nBarBufs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x448,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->nObjCounts[8] < pMan->nRegs) {
    __assert_fail("Aig_ManRegNum(pMan) <= Abc_NtkLatchNum(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x449,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->vCis->nSize < pMan->nTruePis) {
    __assert_fail("Saig_ManPiNum(pMan) <= Abc_NtkCiNum(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x44a,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pMan->nTruePos != pNtkOld->vPos->nSize) {
    __assert_fail("Saig_ManPoNum(pMan) == Abc_NtkPoNum(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,1099,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pMan->vCiNumsOrig == (Vec_Int_t *)0x0) {
    __assert_fail("pMan->vCiNumsOrig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x44c,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = pMan->nBarBufs;
  pAVar5 = Abc_AigConst1(pNtk);
  (pMan->pConst1->field_5).pData = pAVar5;
  if (pMan->nRegs < pMan->nObjs[2]) {
    lVar14 = 0;
    do {
      if (pMan->vCis->nSize <= lVar14) goto LAB_002a8c47;
      pvVar1 = pMan->vCis->pArray[lVar14];
      pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      if (pMan->vCiNumsOrig->nSize <= lVar14) goto LAB_002a8c66;
      iVar4 = pMan->vCiNumsOrig->pArray[lVar14];
      if (((long)iVar4 < 0) || (pNtkOld->vCis->nSize <= iVar4)) goto LAB_002a8c47;
      pcVar6 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCis->pArray[iVar4]);
      Abc_ObjAssignName(pAVar5,pcVar6,(char *)0x0);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (long)pMan->nObjs[2] - (long)pMan->nRegs);
  }
  iVar4 = pMan->nRegs;
  uVar3 = pMan->nObjs[3] - iVar4;
  uVar7 = (ulong)uVar3;
  if (uVar3 != 0 && iVar4 <= pMan->nObjs[3]) {
    lVar14 = 0;
    do {
      if (pMan->vCos->nSize <= lVar14) goto LAB_002a8c47;
      pvVar1 = pMan->vCos->pArray[lVar14];
      pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      if (pNtkOld->vCos->nSize <= lVar14) goto LAB_002a8c47;
      pcVar6 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCos->pArray[lVar14]);
      Abc_ObjAssignName(pAVar5,pcVar6,(char *)0x0);
      lVar14 = lVar14 + 1;
      iVar4 = pMan->nRegs;
      uVar7 = (long)pMan->nObjs[3] - (long)iVar4;
    } while (lVar14 < (long)uVar7);
  }
  if (pNtk->vCis->nSize != pMan->nObjs[2] - iVar4) {
    __assert_fail("Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x467,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vCos->nSize != (int)uVar7) {
    __assert_fail("Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x468,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  iVar4 = pMan->nRegs;
  if (0 < iVar4) {
    iVar13 = 0;
    do {
      uVar3 = (pMan->nObjs[3] - iVar4) + iVar13;
      if (((((int)uVar3 < 0) || (pMan->vCos->nSize <= (int)uVar3)) ||
          (uVar11 = (pMan->nObjs[2] - iVar4) + iVar13, (int)uVar11 < 0)) ||
         (pMan->vCis->nSize <= (int)uVar11)) goto LAB_002a8c47;
      pvVar1 = pMan->vCos->pArray[uVar3];
      pvVar2 = pMan->vCis->pArray[uVar11];
      pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
      pAVar8 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
      *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar8;
      pAVar8 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
      *(Abc_Obj_t **)((long)pvVar2 + 0x28) = pAVar8;
      Abc_ObjAddFanin(pAVar5,*(Abc_Obj_t **)((long)pvVar1 + 0x28));
      Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pvVar2 + 0x28),pAVar5);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pLatch)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                      ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
      }
      pAVar5->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
      uVar3 = pMan->nTruePis + iVar13;
      if (((int)uVar3 < 0) || (pMan->vCiNumsOrig->nSize <= (int)uVar3)) {
LAB_002a8c66:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pMan->vCiNumsOrig->pArray[uVar3];
      if (((long)iVar4 < 0) || (pNtkOld->vCis->nSize <= iVar4)) goto LAB_002a8c47;
      pAVar5 = *(Abc_Obj_t **)((long)pvVar2 + 0x28);
      pcVar6 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCis->pArray[iVar4]);
      Abc_ObjAssignName(pAVar5,pcVar6,(char *)0x0);
      uVar3 = pMan->nTruePos + iVar13;
      if (((int)uVar3 < 0) || (pNtkOld->vCos->nSize <= (int)uVar3)) goto LAB_002a8c47;
      pAVar5 = *(Abc_Obj_t **)((long)pvVar1 + 0x28);
      pcVar6 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCos->pArray[uVar3]);
      Abc_ObjAssignName(pAVar5,pcVar6,(char *)0x0);
      iVar13 = iVar13 + 1;
      iVar4 = pMan->nRegs;
    } while (iVar13 < iVar4);
  }
  pVVar9 = Aig_ManDfs(pMan,1);
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      pvVar1 = pVVar9->pArray[lVar14];
      if ((*(uint *)((long)pvVar1 + 0x18) & 7) == 4) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_002a8c85;
        uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar5 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
      }
      else {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_002a8c85;
        uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar5 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        uVar7 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar8 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        pAVar5 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,pAVar5,pAVar8);
      }
      *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar9->nSize);
  }
  if (pVVar9->pArray != (void **)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (void **)0x0;
  }
  if (pVVar9 != (Vec_Ptr_t *)0x0) {
    free(pVVar9);
  }
  pVVar9 = pMan->vCos;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      if (((ulong)pVVar9->pArray[lVar14] & 1) != 0) {
LAB_002a8c85:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar7 = *(ulong *)((long)pVVar9->pArray[lVar14] + 8);
      uVar10 = uVar7 & 0xfffffffffffffffe;
      if (uVar10 == 0) {
        pAVar5 = (Abc_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Abc_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar10 + 0x28));
      }
      if (pNtk->vCos->nSize <= lVar14) {
LAB_002a8c47:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjAddFanin((Abc_Obj_t *)pNtk->vCos->pArray[lVar14],pAVar5);
      lVar14 = lVar14 + 1;
      pVVar9 = pMan->vCos;
    } while (lVar14 < pVVar9->nSize);
  }
  pAVar12 = pNtk;
  iVar4 = Abc_NtkCheck(pNtk);
  if (iVar4 == 0) {
    Abc_Print((int)pAVar12,"Abc_NtkAfterTrim(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkAfterTrim( Aig_Man_t * pMan, Abc_Ntk_t * pNtkOld )
{
    Vec_Ptr_t * vNodes; 
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pObjOld;
    Aig_Obj_t * pObj, * pObjLo, * pObjLi;
    int i; 
    assert( pMan->nAsserts == 0 );
    assert( pNtkOld->nBarBufs == 0 );
    assert( Aig_ManRegNum(pMan) <= Abc_NtkLatchNum(pNtkOld) );
    assert( Saig_ManPiNum(pMan) <= Abc_NtkCiNum(pNtkOld) );
    assert( Saig_ManPoNum(pMan) == Abc_NtkPoNum(pNtkOld) );
    assert( pMan->vCiNumsOrig != NULL );
    // perform strashing
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pMan->nBarBufs;
    // duplicate the name and the spec
//    pNtkNew->pName = Extra_UtilStrsav(pMan->pName);
//    pNtkNew->pSpec = Extra_UtilStrsav(pMan->pSpec);
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    // create PIs
    Aig_ManForEachPiSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePi( pNtkNew );
        pObj->pData = pObjNew;
        // find the name
        pObjOld = Abc_NtkCi( pNtkOld, Vec_IntEntry(pMan->vCiNumsOrig, i) );
        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjOld), NULL );
    }
    // create POs
    Aig_ManForEachPoSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePo( pNtkNew );
        pObj->pData = pObjNew;
        // find the name
        pObjOld = Abc_NtkCo( pNtkOld, i );
        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjOld), NULL );
    }
    assert( Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) );
    assert( Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) );
    // create as many latches as there are registers in the manager
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjLi->pData = Abc_NtkCreateBi( pNtkNew );
        pObjLo->pData = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, (Abc_Obj_t *)pObjLi->pData );
        Abc_ObjAddFanin( (Abc_Obj_t *)pObjLo->pData, pObjNew );
        Abc_LatchSetInit0( pObjNew );
        // find the name
        pObjOld = Abc_NtkCi( pNtkOld, Vec_IntEntry(pMan->vCiNumsOrig, Saig_ManPiNum(pMan)+i) );
        Abc_ObjAssignName( (Abc_Obj_t *)pObjLo->pData, Abc_ObjName(pObjOld), NULL );
        // find the name
        pObjOld = Abc_NtkCo( pNtkOld, Saig_ManPoNum(pMan)+i );
        Abc_ObjAssignName( (Abc_Obj_t *)pObjLi->pData, Abc_ObjName(pObjOld), NULL );
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
        pObjNew = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
    }
    // check the resulting AIG
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkAfterTrim(): Network check has failed.\n" );
    return pNtkNew;
}